

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varenaalloc.h
# Opt level: O3

SolidLayer * __thiscall
VArenaAlloc::make<rlottie::internal::renderer::SolidLayer,rlottie::internal::model::Layer*&>
          (VArenaAlloc *this,Layer **args)

{
  int iVar1;
  SolidLayer *this_00;
  
  this_00 = (SolidLayer *)allocObjectWithFooter(this,0xc0,8);
  iVar1 = *(int *)&this->fCursor;
  this->fCursor = (char *)(this_00 + 1);
  installFooter(this,make<rlottie::internal::renderer::SolidLayer,_rlottie::internal::model::Layer_*&>
                     ::anon_class_1_0_00000001::__invoke,(int)this_00 - iVar1);
  rlottie::internal::renderer::SolidLayer::SolidLayer(this_00,*args);
  return this_00;
}

Assistant:

T* make(Args&&... args) {
        uint32_t size      = ToU32(sizeof(T));
        uint32_t alignment = ToU32(alignof(T));
        char* objStart;
        if (std::is_trivially_destructible<T>::value) {
            objStart = this->allocObject(size, alignment);
            fCursor = objStart + size;
        } else {
            objStart = this->allocObjectWithFooter(size + sizeof(Footer), alignment);
            // Can never be UB because max value is alignof(T).
            uint32_t padding = ToU32(objStart - fCursor);

            // Advance to end of object to install footer.
            fCursor = objStart + size;
            FooterAction* releaser = [](char* objEnd) {
                char* objStart = objEnd - (sizeof(T) + sizeof(Footer));
                ((T*)objStart)->~T();
                return objStart;
            };
            this->installFooter(releaser, padding);
        }

        // This must be last to make objects with nested use of this allocator work.
        return new(objStart) T(std::forward<Args>(args)...);
    }